

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O1

object_ptr __thiscall
mjs::make_regexp(mjs *this,gc_heap_ptr<mjs::global_object> *global,string *pattern,string *flags)

{
  global_object *global_00;
  undefined8 extraout_RDX;
  object_ptr oVar1;
  gc_heap_ptr_untyped local_40;
  ulong local_30;
  uint *local_28;
  
  local_28 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)pattern);
  local_30 = (ulong)*local_28;
  local_28 = local_28 + 1;
  global_00 = (global_object *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  parse_regexp_flags(global_00,flags);
  regexp_object::make((gc_heap_ptr<mjs::global_object> *)&local_40,(wstring_view *)global,
                      (regexp_flag)&local_30);
  *(gc_heap **)this = local_40.heap_;
  *(uint32_t *)(this + 8) = local_40.pos_;
  if (local_40.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_40.heap_,(gc_heap_ptr_untyped *)this);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
  oVar1.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar1.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar1.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr make_regexp(const gc_heap_ptr<global_object>& global, const string& pattern, const string& flags) {
    return regexp_object::make(global, pattern.view(), parse_regexp_flags(*global, flags));
}